

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_driver.c
# Opt level: O0

int get_font_align(char *value)

{
  int iVar1;
  char *in_RDI;
  int local_24;
  int local_20;
  int local_1c;
  int local_18;
  int local_14;
  int local_10;
  int local_c;
  
  iVar1 = strcmp(in_RDI,"ALLEGRO_ALIGN_LEFT");
  if (iVar1 == 0) {
    local_c = 0;
  }
  else {
    iVar1 = strcmp(in_RDI,"ALLEGRO_ALIGN_CENTRE");
    if (iVar1 == 0) {
      local_10 = 1;
    }
    else {
      iVar1 = strcmp(in_RDI,"ALLEGRO_ALIGN_RIGHT");
      if (iVar1 == 0) {
        local_14 = 2;
      }
      else {
        iVar1 = strcmp(in_RDI,"ALLEGRO_ALIGN_INTEGER");
        if (iVar1 == 0) {
          local_18 = 4;
        }
        else {
          iVar1 = strcmp(in_RDI,"ALLEGRO_ALIGN_LEFT|ALLEGRO_ALIGN_INTEGER");
          if (iVar1 == 0) {
            local_1c = 4;
          }
          else {
            iVar1 = strcmp(in_RDI,"ALLEGRO_ALIGN_RIGHT|ALLEGRO_ALIGN_INTEGER");
            if (iVar1 == 0) {
              local_20 = 6;
            }
            else {
              iVar1 = strcmp(in_RDI,"ALLEGRO_ALIGN_CENTRE|ALLEGRO_ALIGN_INTEGER");
              if (iVar1 == 0) {
                local_24 = 5;
              }
              else {
                local_24 = atoi(in_RDI);
              }
              local_20 = local_24;
            }
            local_1c = local_20;
          }
          local_18 = local_1c;
        }
        local_14 = local_18;
      }
      local_10 = local_14;
    }
    local_c = local_10;
  }
  return local_c;
}

Assistant:

static int get_font_align(char const *value)
{
   return streq(value, "ALLEGRO_ALIGN_LEFT") ? ALLEGRO_ALIGN_LEFT
      : streq(value, "ALLEGRO_ALIGN_CENTRE") ? ALLEGRO_ALIGN_CENTRE
      : streq(value, "ALLEGRO_ALIGN_RIGHT") ? ALLEGRO_ALIGN_RIGHT
      : streq(value, "ALLEGRO_ALIGN_INTEGER") ? ALLEGRO_ALIGN_INTEGER
      : streq(value, "ALLEGRO_ALIGN_LEFT|ALLEGRO_ALIGN_INTEGER")
         ? ALLEGRO_ALIGN_LEFT | ALLEGRO_ALIGN_INTEGER
      : streq(value, "ALLEGRO_ALIGN_RIGHT|ALLEGRO_ALIGN_INTEGER")
         ? ALLEGRO_ALIGN_RIGHT | ALLEGRO_ALIGN_INTEGER
      : streq(value, "ALLEGRO_ALIGN_CENTRE|ALLEGRO_ALIGN_INTEGER")
         ? ALLEGRO_ALIGN_CENTRE | ALLEGRO_ALIGN_INTEGER
      : atoi(value);
}